

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

bool tcu::astc::anon_unknown_0::isValidBlockParams
               (NormalBlockParams *params,int blockWidth,int blockHeight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int numPartitions;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = params->weightGridWidth;
  iVar3 = params->weightGridHeight;
  bVar1 = params->isDualPlane;
  iVar6 = iVar3 * iVar2 << (bVar1 & 0x1fU);
  numPartitions = params->numPartitions;
  iVar4 = computeNumColorEndpointValues
                    (params->colorEndpointModes,numPartitions,params->isMultiPartSingleCemMode);
  iVar5 = computeNumBitsForColorEndpoints(params);
  if (iVar6 < 0x41) {
    iVar6 = computeNumRequiredBits(&params->weightISEParams,iVar6);
    if (blockHeight < iVar3) {
      return false;
    }
    if (blockWidth < iVar2) {
      return false;
    }
    if (iVar6 - 0x61U < 0xffffffb7) {
      return false;
    }
    if (numPartitions == 4) {
      if (iVar4 < 0x13 && bVar1 == false) {
LAB_01625ba1:
        return (int)(((iVar4 * 0xd) / 5 + 1) - (uint)((iVar4 * 0xd) % 5 == 0)) <= iVar5;
      }
    }
    else if (iVar4 < 0x13) goto LAB_01625ba1;
  }
  return false;
}

Assistant:

static inline bool isValidBlockParams (const NormalBlockParams& params, int blockWidth, int blockHeight)
{
	const int numWeights				= computeNumWeights(params);
	const int numWeightBits				= computeNumRequiredBits(params.weightISEParams, numWeights);
	const int numColorEndpointValues	= computeNumColorEndpointValues(&params.colorEndpointModes[0], params.numPartitions, params.isMultiPartSingleCemMode);
	const int numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(params);

	return numWeights <= 64										&&
		   de::inRange(numWeightBits, 24, 96)					&&
		   params.weightGridWidth <= blockWidth					&&
		   params.weightGridHeight <= blockHeight				&&
		   !(params.numPartitions == 4 && params.isDualPlane)	&&
		   numColorEndpointValues <= 18							&&
		   numBitsForColorEndpoints >= deDivRoundUp32(13*numColorEndpointValues, 5);
}